

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  string *this_00;
  void *pvVar1;
  long *plVar2;
  MapValueRef *this_local;
  
  switch((this->super_MapValueConstRef).type_) {
  case CPPTYPE_INT32:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_INT64:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_UINT32:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_UINT64:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_DOUBLE:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_FLOAT:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_BOOL:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_ENUM:
    pvVar1 = (this->super_MapValueConstRef).data_;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    break;
  case CPPTYPE_STRING:
    this_00 = (string *)(this->super_MapValueConstRef).data_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
    break;
  case CPPTYPE_MESSAGE:
    plVar2 = (long *)(this->super_MapValueConstRef).data_;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    delete reinterpret_cast<TYPE*>(data_);   \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32_t);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }